

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Bac_ManWriteSig(Bac_Ntk_t *p,int iObj)

{
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  int Beg;
  
  if ((-1 < iObj) && (uVar3 = (p->vType).nSize, iObj < (int)uVar3)) {
    pcVar2 = (p->vType).pArray;
    if ((pcVar2[(uint)iObj] & 0xfcU) == 4) {
      if ((p->vFanin).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iObj = (p->vFanin).pArray[(uint)iObj];
      if (iObj < 0) goto LAB_00326de7;
    }
    if ((uint)iObj < uVar3) {
      bVar1 = pcVar2[(uint)iObj];
      if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
        __assert_fail("Bac_ObjIsCi(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacWriteVer.c"
                      ,0x10c,"void Bac_ManWriteSig(Bac_Ntk_t *, int)");
      }
      if ((bVar1 & 0xfe) == 8) {
        if (uVar3 <= iObj - 1U) goto LAB_00326de7;
        if (0xf7 < (byte)(pcVar2[iObj - 1U] - 0x14U)) {
          Bac_ManWriteConstBit(p,iObj,1);
          return;
        }
      }
      uVar3 = Bac_ObjName(p,iObj);
      if (uVar3 == 0) {
        __assert_fail("n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                      ,0x107,"Bac_NameType_t Bac_NameType(int)");
      }
      if (-1 < (int)uVar3) {
        if ((uVar3 & 3) != 0) {
          Bac_ManFindRealNameId(p,iObj);
          Bac_ManWriteVar((Bac_Ntk_t *)p->pDesign->pStrs,(int)p->pDesign->vOut);
          Beg = Bac_ManFindRealIndex(p,iObj);
          Bac_ManWriteRange((Bac_Ntk_t *)p->pDesign->vOut,Beg,-1);
          return;
        }
        Bac_ManWriteVar((Bac_Ntk_t *)p->pDesign->pStrs,(int)p->pDesign->vOut);
        return;
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x11b,"int Abc_Lit2Att2(int)");
    }
  }
LAB_00326de7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline void Bac_ManWriteSig( Bac_Ntk_t * p, int iObj )
{
    if ( Bac_ObjIsCo(p, iObj) )
        iObj = Bac_ObjFanin(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
    if ( Bac_ObjGetConst(p, iObj) )
        Bac_ManWriteConstBit( p, iObj, 1 );
    else
    {
        int NameId = Bac_ObjName(p, iObj);
        if ( Bac_NameType(NameId) == BAC_NAME_BIN )
            Bac_ManWriteVar( p, Abc_Lit2Var2(NameId) );
        else
        {
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, iObj) );
            Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, iObj), -1 );
        }
    }
}